

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O2

uint64_t __thiscall tcmalloc::Span::InitFreeList(Span *this,uint64_t obj_bytes)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong *puVar3;
  long lVar4;
  ulong *puVar5;
  uint64_t uVar6;
  ulong *puVar7;
  
  if (this->location == 0) {
    (this->freelist).free_count_ = 0;
    (this->freelist).head_ = (void *)0x0;
    uVar1 = this->page_id;
    uVar2 = this->npages;
    uVar6 = 1;
    lVar4 = 0;
    puVar3 = (ulong *)(uVar1 << 0xd);
    puVar7 = (ulong *)0x0;
    while (puVar5 = puVar3, (ulong *)((long)puVar5 + obj_bytes) <= (uVar1 + uVar2) * 0x2000) {
      *puVar5 = (ulong)puVar7;
      (this->freelist).head_ = puVar5;
      (this->freelist).free_count_ = uVar6;
      lVar4 = lVar4 + 0x100000000;
      uVar6 = uVar6 + 1;
      puVar3 = (ulong *)((long)puVar5 + obj_bytes);
      puVar7 = puVar5;
    }
    return lVar4 >> 0x20;
  }
  __assert_fail("location == IN_USE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/span.hpp"
                ,0x42,"uint64_t tcmalloc::Span::InitFreeList(uint64_t)");
}

Assistant:

uint64_t InitFreeList(uint64_t obj_bytes) {
        assert(location == IN_USE);
        freelist.Clear();
        assert(freelist.Empty());
        uint64_t ptr = reinterpret_cast<uint64_t>(reinterpret_cast<char *>(page_id * spanPageSize));
        uint64_t limit = ptr + (npages * spanPageSize);
        while (ptr + obj_bytes <= limit) {
            freelist.PushFront((void*)ptr);
            ptr += obj_bytes;
        }
        return freelist.FreeObjects();
    }